

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O3

int FindHostApi(PaDeviceIndex device,int *hostSpecificDeviceIndex)

{
  int iVar1;
  long lVar2;
  
  if (((-1 < device) && (initializationCount_ != 0)) && (0 < (long)hostApisCount_)) {
    lVar2 = 0;
    do {
      iVar1 = (hostApis_[lVar2]->info).deviceCount;
      if (device < iVar1) {
        if (hostSpecificDeviceIndex != (int *)0x0) {
          *hostSpecificDeviceIndex = device;
        }
        return (int)lVar2;
      }
      lVar2 = lVar2 + 1;
      device = device - iVar1;
    } while (hostApisCount_ != lVar2);
  }
  return -1;
}

Assistant:

static int FindHostApi( PaDeviceIndex device, int *hostSpecificDeviceIndex )
{
    int i=0;

    if( !PA_IS_INITIALISED_ )
        return -1;

    if( device < 0 )
        return -1;

    while( i < hostApisCount_
            && device >= hostApis_[i]->info.deviceCount )
    {

        device -= hostApis_[i]->info.deviceCount;
        ++i;
    }

    if( i >= hostApisCount_ )
        return -1;

    if( hostSpecificDeviceIndex )
        *hostSpecificDeviceIndex = device;

    return i;
}